

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsed_operand.cpp
# Opt level: O3

void spvtools::EmitNumericLiteral
               (ostream *out,spv_parsed_instruction_t *inst,spv_parsed_operand_t *operand)

{
  spv_number_kind_t sVar1;
  HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
  local_e;
  FloatProxy<float> local_c;
  FloatProxy<double> local_8;
  
  if ((((ulong)operand->type < 0x30) &&
      ((0xa00000000640U >> ((ulong)operand->type & 0x3f) & 1) != 0)) &&
     (0xfffd < (ushort)(operand->num_words - 3))) {
    local_c.data_ = inst->words[operand->offset];
    if (operand->num_words == 1) {
      sVar1 = operand->number_kind;
      if (sVar1 == SPV_NUMBER_UNSIGNED_INT) {
LAB_001ba84a:
        std::ostream::_M_insert<unsigned_long>((ulong)out);
        return;
      }
      if (sVar1 == SPV_NUMBER_FLOATING) {
        if (operand->number_bit_width == 0x10) {
          local_e.value_.data_ = SUB42(local_c.data_,0);
          utils::operator<<(out,&local_e);
        }
        else {
          utils::operator<<(out,&local_c);
        }
      }
      else if (sVar1 == SPV_NUMBER_SIGNED_INT) {
        std::ostream::operator<<(out,local_c.data_);
        return;
      }
    }
    else {
      local_8.data_ = CONCAT44(inst->words[(ulong)operand->offset + 1],local_c.data_);
      sVar1 = operand->number_kind;
      if (sVar1 == SPV_NUMBER_UNSIGNED_INT) goto LAB_001ba84a;
      if (sVar1 == SPV_NUMBER_FLOATING) {
        utils::operator<<(out,&local_8);
      }
      else if (sVar1 == SPV_NUMBER_SIGNED_INT) {
        std::ostream::_M_insert<long>((long)out);
        return;
      }
    }
  }
  return;
}

Assistant:

void EmitNumericLiteral(std::ostream* out, const spv_parsed_instruction_t& inst,
                        const spv_parsed_operand_t& operand) {
  if (operand.type != SPV_OPERAND_TYPE_LITERAL_INTEGER &&
      operand.type != SPV_OPERAND_TYPE_LITERAL_FLOAT &&
      operand.type != SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER &&
      operand.type != SPV_OPERAND_TYPE_OPTIONAL_LITERAL_INTEGER &&
      operand.type != SPV_OPERAND_TYPE_OPTIONAL_TYPED_LITERAL_INTEGER)
    return;
  if (operand.num_words < 1) return;
  // TODO(dneto): Support more than 64-bits at a time.
  if (operand.num_words > 2) return;

  const uint32_t word = inst.words[operand.offset];
  if (operand.num_words == 1) {
    switch (operand.number_kind) {
      case SPV_NUMBER_SIGNED_INT:
        *out << int32_t(word);
        break;
      case SPV_NUMBER_UNSIGNED_INT:
        *out << word;
        break;
      case SPV_NUMBER_FLOATING:
        if (operand.number_bit_width == 16) {
          *out << spvtools::utils::FloatProxy<spvtools::utils::Float16>(
              uint16_t(word & 0xFFFF));
        } else {
          // Assume 32-bit floats.
          *out << spvtools::utils::FloatProxy<float>(word);
        }
        break;
      default:
        break;
    }
  } else if (operand.num_words == 2) {
    // Multi-word numbers are presented with lower order words first.
    uint64_t bits =
        uint64_t(word) | (uint64_t(inst.words[operand.offset + 1]) << 32);
    switch (operand.number_kind) {
      case SPV_NUMBER_SIGNED_INT:
        *out << int64_t(bits);
        break;
      case SPV_NUMBER_UNSIGNED_INT:
        *out << bits;
        break;
      case SPV_NUMBER_FLOATING:
        // Assume only 64-bit floats.
        *out << spvtools::utils::FloatProxy<double>(bits);
        break;
      default:
        break;
    }
  }
}